

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_utils.cc
# Opt level: O0

Scalar RigidBodyDynamics::Utils::CalcPotentialEnergy
                 (Model *model,VectorNd *q,bool update_kinematics)

{
  uint uVar1;
  byte in_DL;
  double *in_RSI;
  double *in_RDI;
  ReturnType RVar2;
  Vector3d g;
  Vector3d com;
  Scalar mass;
  undefined1 in_stack_000007e7;
  Vector3d *in_stack_000007e8;
  Scalar *in_stack_000007f0;
  VectorNd *in_stack_000007f8;
  VectorNd *in_stack_00000800;
  VectorNd *in_stack_00000808;
  Model *in_stack_00000810;
  Vector3d *in_stack_00000820;
  Vector3d *in_stack_00000828;
  Vector3d *in_stack_00000830;
  Vector3d *in_stack_00000838;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *in_stack_fffffffffffffee8;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *other;
  Matrix<double,__1,_1,_0,__1,_1> *in_stack_fffffffffffffef0;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this;
  Index in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff0c;
  double *v2;
  Vector3_t *this_00;
  double local_60 [3];
  Vector3_t local_48;
  double local_20;
  byte local_11;
  double *local_10;
  double *local_8;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  local_8 = in_RDI;
  Vector3_t::Vector3_t((Vector3_t *)0x6b4604);
  v2 = local_60;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero(in_stack_fffffffffffffef8);
  this_00 = &local_48;
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  uVar1 = local_11 & 1;
  this = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)0x0;
  other = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)0x0;
  CalcCenterOfMass(in_stack_00000810,in_stack_00000808,in_stack_00000800,in_stack_000007f8,
                   in_stack_000007f0,in_stack_000007e8,in_stack_00000820,in_stack_00000828,
                   in_stack_00000830,in_stack_00000838,(bool)in_stack_000007e7);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x6b46b0);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
            ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)this,(Index)other);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
            ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)this,(Index)other);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
            ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)this,(Index)other);
  Vector3_t::Vector3_t(this_00,local_10,local_8,v2);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator-
            ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             CONCAT44(in_stack_ffffffffffffff0c,uVar1));
  Vector3_t::
  Vector3_t<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Vector3_t *)this,
             (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)other);
  RVar2 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::dot<Eigen::Matrix<double,3,1,0,3,1>>
                    (this,other);
  return local_20 * RVar2;
}

Assistant:

RBDL_DLLAPI Scalar CalcPotentialEnergy (
  Model &model,
  const Math::VectorNd &q,
  bool update_kinematics)
{
  Scalar mass;
  Vector3d com;
  CalcCenterOfMass (
    model,
    q,
    VectorNd::Zero (model.qdot_size),
    NULL,
    mass,
    com,
    NULL,
    NULL,
    NULL,
    NULL,
    update_kinematics);

  Vector3d g = - Vector3d (model.gravity[0], model.gravity[1], model.gravity[2]);
  LOG << "pot_energy: " << " mass = " << mass << " com = " << com.transpose() <<
      std::endl;

  return mass * com.dot(g);
}